

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.cpp
# Opt level: O2

int GetHeadDataSeanetEx(SEANET *pSeanet,uchar *scanline,double *pAngle)

{
  int *piVar1;
  uchar *puVar2;
  int iVar3;
  char *pcVar4;
  timeval *ptVar5;
  double *pdVar6;
  uint uVar7;
  size_t __nmemb;
  long lVar8;
  double dVar9;
  int byte;
  int Bearing;
  char SOf [4];
  int Node;
  int Min;
  int Hour;
  uchar *local_4098;
  int *local_4090;
  double *local_4088;
  int *local_4080;
  int *local_4078;
  int *local_4070;
  int *local_4068;
  int *local_4060;
  int *local_4058;
  double Seconds;
  char data [8193];
  char line [8193];
  
  if (bSeanetFromFile == 0) {
    iVar3 = GetHeadDataSeanet(pSeanet,scanline,pAngle);
    return iVar3;
  }
  Hour = 0;
  Min = 0;
  Node = 0;
  Bearing = 0;
  Seconds = 0.0;
  byte = 0;
  mSleep((long)pSeanet->threadperiod);
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  if (seanetfilenextlinecmd < 1) {
    if (seanetfilenextlinecmd == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      return 0;
    }
  }
  else {
    seanetfilenextlinecmd = seanetfilenextlinecmd + -1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  pcVar4 = fgets3(seanetfile,line,0x2001);
  if (pcVar4 == (char *)0x0) {
    puts("Error reading Seanet CSV file.");
    return 1;
  }
  SOf[0] = '\0';
  SOf[1] = '\0';
  SOf[2] = '\0';
  SOf[3] = '\0';
  pcVar4 = data;
  Hdctrl.u = 0;
  data[0x2000] = '\0';
  local_4058 = &pSeanet->HeadStatus;
  local_4060 = &pSeanet->HeadRangescale;
  local_4068 = &pSeanet->HeadIGain;
  local_4070 = &pSeanet->HeadSlope;
  local_4078 = &pSeanet->HeadADLow;
  local_4080 = &pSeanet->HeadADSpan;
  piVar1 = &pSeanet->HeadSteps;
  local_4090 = &pSeanet->Dbytes;
  local_4098 = scanline;
  local_4088 = pAngle;
  iVar3 = __isoc99_sscanf(line,"%03s,%d:%d:%lf,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%8192s",SOf,
                          &Hour,&Min,&Seconds,&Node,local_4058,&pSeanet->HeadHdCtrl,local_4060,
                          local_4068,local_4070,local_4078,local_4080,&pSeanet->HeadLeftLim,
                          &pSeanet->HeadRightLim,piVar1,&Bearing,local_4090,pcVar4);
  if (iVar3 != 0x12) {
    puts("Skipping an invalid line in the CSV file.");
    return 0;
  }
  pSeanet->bDST = (uint)(SOf == (char  [4])0x474944);
  uVar7 = (pSeanet->HeadHdCtrl).u & 1;
  pSeanet->adc8on = uVar7;
  pSeanet->HeadNBins = pSeanet->Dbytes << ((byte)uVar7 ^ 1);
  dVar9 = (double)pSeanet->HeadSteps * 0.05625;
  pSeanet->NSteps = (int)(360.0 / dVar9);
  pSeanet->StepAngleSize = dVar9;
  pSeanet->RangeScale = pSeanet->HeadRangescale / 10;
  pthread_mutex_lock((pthread_mutex_t *)&SeanetConnectingCS);
  if (AdLow == pSeanet->HeadADLow) {
    iVar3 = *piVar1;
    if (((((AdSpan == pSeanet->HeadADSpan) && (Steps == iVar3)) &&
         (Hdctrl.u == (pSeanet->HeadHdCtrl).u)) &&
        ((NBins == pSeanet->HeadNBins && (NSteps == pSeanet->NSteps)))) &&
       ((StepAngleSize == pSeanet->StepAngleSize &&
        ((!NAN(StepAngleSize) && !NAN(pSeanet->StepAngleSize) && (rangescale == pSeanet->RangeScale)
         ))))) goto LAB_00170f81;
  }
  else {
    iVar3 = *piVar1;
  }
  Hdctrl = pSeanet->HeadHdCtrl;
  NBins = pSeanet->HeadNBins;
  NSteps = pSeanet->NSteps;
  StepAngleSize = pSeanet->StepAngleSize;
  rangescale = pSeanet->RangeScale;
  index_scanlines_prev = 0;
  index_scanlines = 0;
  AdLow = pSeanet->HeadADLow;
  AdSpan = pSeanet->HeadADSpan;
  Steps = iVar3;
  free(tvs);
  free(angles);
  free(scanlines);
  __nmemb = (size_t)NSteps;
  ptVar5 = (timeval *)calloc(__nmemb,0x10);
  tvs = ptVar5;
  pdVar6 = (double *)calloc(__nmemb,8);
  angles = pdVar6;
  scanlines = (uchar *)calloc(__nmemb << 0xb,1);
  if ((pdVar6 == (double *)0x0 || ptVar5 == (timeval *)0x0) || scanlines == (uchar *)0x0) {
    puts("Unable to allocate Seanet data.");
    pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
    return 1;
  }
LAB_00170f81:
  pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
  puVar2 = local_4098;
  *local_4088 = (double)((Bearing + 0xc80) % 0x1900) * 0.05625;
  if ((Hdctrl.u & 1) == 0) {
    pcVar4 = data;
    for (lVar8 = 0; lVar8 < *local_4090; lVar8 = lVar8 + 1) {
      __isoc99_sscanf(pcVar4,"%d",&byte);
      puVar2[lVar8 * 2] = (byte)byte & 0xf0;
      puVar2[lVar8 * 2 + 1] = (byte)byte << 4;
      pcVar4 = strchr(pcVar4,0x2c);
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      pcVar4 = pcVar4 + 1;
    }
  }
  else {
    for (lVar8 = 0; lVar8 < *local_4090; lVar8 = lVar8 + 1) {
      __isoc99_sscanf(pcVar4,"%d",&byte);
      puVar2[lVar8] = (byte)byte;
      pcVar4 = strchr(pcVar4,0x2c);
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      pcVar4 = pcVar4 + 1;
    }
  }
  return 0;
}

Assistant:

int GetHeadDataSeanetEx(SEANET* pSeanet, unsigned char* scanline, double* pAngle)
{
	if (!bSeanetFromFile) return GetHeadDataSeanet(pSeanet, scanline, pAngle);
	else
	{
		char line[4*MAX_NB_BYTES_SEANET+1];
		int i = 0;

		int Hour = 0, Min = 0, Node = 0, Bearing = 0;
		double Seconds = 0;
		char SOf[3+1];
		char data[4*MAX_NB_BYTES_SEANET+1];
		char* str = NULL;
		int byte = 0;

		mSleep(pSeanet->threadperiod);

		EnterCriticalSection(&StateVariablesCS);
		if (seanetfilenextlinecmd > 0) seanetfilenextlinecmd--;
		else if (seanetfilenextlinecmd == 0) { LeaveCriticalSection(&StateVariablesCS); return EXIT_SUCCESS; }
		LeaveCriticalSection(&StateVariablesCS);

		// Get a sonar scanline from the file.
		if (fgets3(seanetfile, line, sizeof(line)) == NULL)
		{
			printf("Error reading Seanet CSV file.\n");
			return EXIT_FAILURE;
		}

		memset(SOf, 0, sizeof(SOf));
		//memset(data, 0, sizeof(data));
		data[sizeof(data)-1] = 0; // The last character must be a 0 to be a valid string for sscanf.
		Hdctrl.i = 0;

		if (sscanf(line, "%03s,%d:%d:%lf,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%8192s",
			SOf, &Hour, &Min, &Seconds, &Node, &pSeanet->HeadStatus, &pSeanet->HeadHdCtrl.i, &pSeanet->HeadRangescale, &pSeanet->HeadIGain, &pSeanet->HeadSlope,
			&pSeanet->HeadADLow, &pSeanet->HeadADSpan, &pSeanet->HeadLeftLim, &pSeanet->HeadRightLim, &pSeanet->HeadSteps, &Bearing, &pSeanet->Dbytes, data) != 18)
		{
			printf("Skipping an invalid line in the CSV file.\n");
			return EXIT_SUCCESS;
		}

		if (strcmp(SOf, "DIG") == 0) pSeanet->bDST = TRUE; else pSeanet->bDST = FALSE;
		pSeanet->adc8on = (BOOL)pSeanet->HeadHdCtrl.bits.adc8on;
		pSeanet->HeadNBins = pSeanet->HeadHdCtrl.bits.adc8on?pSeanet->Dbytes:2*pSeanet->Dbytes;
		pSeanet->NSteps = RESOLUTION2NUMBER_OF_STEPS(pSeanet->HeadSteps);
		pSeanet->StepAngleSize = RESOLUTION2STEP_ANGLE_SIZE_IN_DEGREES(pSeanet->HeadSteps);
		pSeanet->RangeScale = pSeanet->HeadRangescale/10;


		// To check and put in common code (change return with break, etc.)...?

		EnterCriticalSection(&SeanetConnectingCS);
		if ((AdLow != pSeanet->HeadADLow)||(AdSpan != pSeanet->HeadADSpan)||(Steps != pSeanet->HeadSteps)||(Hdctrl.u != pSeanet->HeadHdCtrl.u)||(NBins != pSeanet->HeadNBins)||
			(NSteps != pSeanet->NSteps)||(StepAngleSize != pSeanet->StepAngleSize)||(rangescale != pSeanet->RangeScale))
		{
			AdLow = pSeanet->HeadADLow; AdSpan = pSeanet->HeadADSpan; Steps = pSeanet->HeadSteps; Hdctrl.u = pSeanet->HeadHdCtrl.u; NBins = pSeanet->HeadNBins;
			NSteps = pSeanet->NSteps; StepAngleSize = pSeanet->StepAngleSize; rangescale = pSeanet->RangeScale;

			index_scanlines_prev = 0;
			index_scanlines = 0;

			free(tvs); free(angles); free(scanlines);
			tvs = NULL; angles = NULL; scanlines = NULL;
			tvs = (struct timeval*)calloc(NSteps, sizeof(struct timeval));
			angles = (double*)calloc(NSteps, sizeof(double));
			scanlines = (unsigned char*)calloc(NSteps*MAX_NB_BYTES_SEANET, sizeof(unsigned char));
			if ((tvs == NULL)||(angles == NULL)||(scanlines == NULL))
			{
				printf("Unable to allocate Seanet data.\n");
				LeaveCriticalSection(&SeanetConnectingCS);
				return EXIT_FAILURE;
			}
		}
		LeaveCriticalSection(&SeanetConnectingCS);


		//tv.tv_sec = Hour*3600+Min*60+(long)Seconds;
		//tv.tv_usec = (long)((Seconds-(long)Seconds)*1000000.0);
		*pAngle = ((Bearing-3200+6400)%6400)*0.05625; // Angle of the transducer in degrees (0.05625 = (1/16)*(9/10)).

		// We should take into account ADLow and ADSpan here?

		str = data;
		if (!Hdctrl.bits.adc8on)
		{
			for (i = 0; i < pSeanet->Dbytes; i++)
			{
				(void)sscanf(str, "%d", &byte);
				scanline[2*i+0] = (unsigned char)((byte>>4)*16);
				scanline[2*i+1] = (unsigned char)(((byte<<4)>>4)*16);
				str = strchr(str, ',');
				if (!str) break;
				str++;
			}
		}
		else
		{
			for (i = 0; i < pSeanet->Dbytes; i++)
			{
				(void)sscanf(str, "%d", &byte);
				scanline[i] = (unsigned char)byte;
				str = strchr(str, ',');
				if (!str) break;
				str++;
			}
		}

		return EXIT_SUCCESS;
	}
}